

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest_DecodeDeterministicOutput_Test::
~EncodeDecodeTest_DecodeDeterministicOutput_Test
          (EncodeDecodeTest_DecodeDeterministicOutput_Test *this)

{
  compiler::anon_unknown_0::EncodeDecodeTest_DecodeDeterministicOutput_Test::
  ~EncodeDecodeTest_DecodeDeterministicOutput_Test
            ((EncodeDecodeTest_DecodeDeterministicOutput_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, DecodeDeterministicOutput) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(golden_path);
  EXPECT_FALSE(
      Run("google/protobuf/unittest.proto"
          " --decode=proto2_unittest.TestAllTypes --deterministic_output"));
  ExpectError("Can only use --deterministic_output with --encode.");
}